

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclDnsize.c
# Opt level: O2

int Abc_SclCheckImprovement
              (SC_Man *p,Abc_Obj_t *pObj,Vec_Int_t *vNodes,Vec_Int_t *vEvals,int Notches,
              int DelayGap)

{
  float fVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  void *pvVar4;
  int iVar5;
  int i;
  abctime aVar6;
  SC_Cell *pCell;
  Abc_Obj_t *pAVar7;
  abctime aVar8;
  SC_Cell *pSVar9;
  int Fill;
  int iVar10;
  int iVar11;
  Vec_Int_t *p_00;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  int local_60;
  float local_5c;
  
  aVar6 = Abc_Clock();
  pCell = Abc_SclObjCell(pObj);
  p->vTimes2->nSize = 0;
  for (iVar10 = 0; iVar10 < vNodes->nSize; iVar10 = iVar10 + 1) {
    pAVar3 = p->pNtk;
    iVar5 = Vec_IntEntry(vNodes,iVar10);
    pAVar7 = Abc_NtkObj(pAVar3,iVar5);
    if (pAVar7 != (Abc_Obj_t *)0x0) {
      Vec_FltPush(p->vTimes2,p->pTimes[(uint)pAVar7->Id].rise);
      Vec_FltPush(p->vTimes2,p->pTimes[(uint)pAVar7->Id].fall);
      Vec_FltPush(p->vTimes2,p->pSlews[(uint)pAVar7->Id].rise);
      Vec_FltPush(p->vTimes2,p->pSlews[(uint)pAVar7->Id].fall);
    }
  }
  p->vTimes3->nSize = 0;
  for (iVar10 = 0; iVar10 < vEvals->nSize; iVar10 = iVar10 + 1) {
    pAVar3 = p->pNtk;
    iVar5 = Vec_IntEntry(vEvals,iVar10);
    pAVar7 = Abc_NtkObj(pAVar3,iVar5);
    if (pAVar7 != (Abc_Obj_t *)0x0) {
      Vec_FltPush(p->vTimes3,p->pTimes[(uint)pAVar7->Id].rise);
      Vec_FltPush(p->vTimes3,p->pTimes[(uint)pAVar7->Id].fall);
    }
  }
  p->vLoads2->nSize = 0;
  for (lVar12 = 0; lVar12 < (pObj->vFanins).nSize; lVar12 = lVar12 + 1) {
    pvVar4 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar12]];
    Vec_FltPush(p->vLoads2,p->pLoads[*(uint *)((long)pvVar4 + 0x10)].rise);
    Vec_FltPush(p->vLoads2,p->pLoads[*(uint *)((long)pvVar4 + 0x10)].fall);
  }
  local_5c = (float)-DelayGap;
  local_60 = -1;
  iVar10 = 0;
  for (pSVar9 = pCell; pSVar9 != pCell || iVar10 == 0; pSVar9 = pSVar9->pPrev) {
    if (pSVar9->area < pCell->area) {
      if (Notches < iVar10) break;
      Abc_SclObjSetCell(pObj,pSVar9);
      Abc_SclUpdateLoad(p,pObj,pCell,pSVar9);
      Abc_SclTimeCone(p,vNodes);
      Abc_SclObjSetCell(pObj,pCell);
      iVar5 = 0;
      for (lVar12 = 0; lVar12 < (pObj->vFanins).nSize; lVar12 = lVar12 + 1) {
        pvVar4 = pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar12]];
        iVar11 = iVar5 + 1;
        fVar13 = Vec_FltEntry(p->vLoads2,iVar5);
        p->pLoads[*(uint *)((long)pvVar4 + 0x10)].rise = fVar13;
        iVar5 = iVar5 + 2;
        fVar13 = Vec_FltEntry(p->vLoads2,iVar11);
        p->pLoads[*(uint *)((long)pvVar4 + 0x10)].fall = fVar13;
      }
      if (p->vLoads2->nSize != iVar5) {
        __assert_fail("Vec_FltSize(p->vLoads2) == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclSize.h"
                      ,0x136,"void Abc_SclLoadRestore(SC_Man *, Abc_Obj_t *)");
      }
      fVar13 = p->MaxDelay0;
      fVar16 = 0.0;
      iVar11 = 0;
      for (iVar5 = 0; iVar5 < vEvals->nSize; iVar5 = iVar5 + 1) {
        pAVar3 = p->pNtk;
        i = Vec_IntEntry(vEvals,iVar5);
        pAVar7 = Abc_NtkObj(pAVar3,i);
        if (pAVar7 != (Abc_Obj_t *)0x0) {
          fVar14 = Vec_FltEntry(p->vTimes3,iVar11);
          fVar14 = fVar14 - p->pTimes[(uint)pAVar7->Id].rise;
          fVar15 = Vec_FltEntry(p->vTimes3,iVar11 + 1);
          uVar2 = pAVar7->Id;
          if (((fVar13 - (p->pTimes[uVar2].rise + p->pDepts[uVar2].rise)) + fVar14 < 0.0) ||
             (fVar1 = p->pTimes[uVar2].fall, fVar15 = fVar15 - fVar1,
             (fVar13 - (fVar1 + p->pDepts[uVar2].fall)) + fVar15 < 0.0)) goto LAB_0038eb61;
          iVar11 = iVar11 + 2;
          fVar16 = fVar16 + fVar14 * 0.5 + fVar15 * 0.5;
        }
      }
      if (p->vTimes3->nSize != iVar11) {
        __assert_fail("Vec_FltSize(p->vTimes3) == k",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclSize.h"
                      ,0x193,"float Abc_SclEvalPerformLegal(SC_Man *, Vec_Int_t *, float)");
      }
      fVar16 = fVar16 / (float)vEvals->nSize;
      if (((fVar16 != -1.0) || (NAN(fVar16))) && (local_5c < fVar16)) {
        local_60 = pSVar9->Id;
        local_5c = fVar16;
      }
    }
LAB_0038eb61:
    iVar10 = iVar10 + 1;
  }
  Abc_SclObjSetCell(pObj,pCell);
  iVar5 = 0;
  for (iVar10 = 0; iVar10 < vNodes->nSize; iVar10 = iVar10 + 1) {
    pAVar3 = p->pNtk;
    iVar11 = Vec_IntEntry(vNodes,iVar10);
    pAVar7 = Abc_NtkObj(pAVar3,iVar11);
    if (pAVar7 != (Abc_Obj_t *)0x0) {
      fVar13 = Vec_FltEntry(p->vTimes2,iVar5);
      p->pTimes[(uint)pAVar7->Id].rise = fVar13;
      fVar13 = Vec_FltEntry(p->vTimes2,iVar5 + 1);
      p->pTimes[(uint)pAVar7->Id].fall = fVar13;
      iVar11 = iVar5 + 3;
      fVar13 = Vec_FltEntry(p->vTimes2,iVar5 + 2);
      p->pSlews[(uint)pAVar7->Id].rise = fVar13;
      iVar5 = iVar5 + 4;
      fVar13 = Vec_FltEntry(p->vTimes2,iVar11);
      p->pSlews[(uint)pAVar7->Id].fall = fVar13;
    }
  }
  if (p->vTimes2->nSize != iVar5) {
    __assert_fail("Vec_FltSize(p->vTimes2) == k",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclSize.h"
                  ,0x16b,"void Abc_SclConeRestore(SC_Man *, Vec_Int_t *)");
  }
  aVar8 = Abc_Clock();
  p->timeSize = p->timeSize + (aVar8 - aVar6);
  if (local_60 < 0) {
    iVar10 = 0;
  }
  else {
    pSVar9 = (SC_Cell *)Vec_PtrEntry(&p->pLib->vCells,local_60);
    Abc_SclObjSetCell(pObj,pSVar9);
    p->SumArea = (pSVar9->area - pCell->area) + p->SumArea;
    for (iVar10 = 0; iVar10 < vNodes->nSize; iVar10 = iVar10 + 1) {
      pAVar3 = p->pNtk;
      iVar5 = Vec_IntEntry(vNodes,iVar10);
      pAVar7 = Abc_NtkObj(pAVar3,iVar5);
      if (pAVar7 != (Abc_Obj_t *)0x0) {
        iVar5 = pAVar7->pNtk->nTravIds;
        p_00 = &pAVar7->pNtk->vTravIds;
        iVar11 = pAVar7->Id;
        Vec_IntFillExtra(p_00,iVar11 + 1,Fill);
        Vec_IntWriteEntry(p_00,iVar11,iVar5);
      }
    }
    Abc_SclUpdateLoad(p,pObj,pCell,pSVar9);
    Abc_SclTimeIncInsert(p,pObj);
    iVar10 = 1;
  }
  return iVar10;
}

Assistant:

int Abc_SclCheckImprovement( SC_Man * p, Abc_Obj_t * pObj, Vec_Int_t * vNodes, Vec_Int_t * vEvals, int Notches, int DelayGap )
{
    Abc_Obj_t * pTemp;
    SC_Cell * pCellOld, * pCellNew;
    float dGain, dGainBest;
    int i, k, gateBest;
    abctime clk;
clk = Abc_Clock();
//    printf( "%d -> %d\n", Vec_IntSize(vNodes), Vec_IntSize(vEvals) );
    // save old gate, timing, fanin load
    pCellOld = Abc_SclObjCell( pObj );
    Abc_SclConeStore( p, vNodes );
    Abc_SclEvalStore( p, vEvals );
    Abc_SclLoadStore( p, pObj );
    // try different gate sizes for this node
    gateBest = -1;
    dGainBest = -DelayGap;
    SC_RingForEachCellRev( pCellOld, pCellNew, i )
    {
        if ( pCellNew->area >= pCellOld->area )
            continue;
        if ( i > Notches )
            break;
        // set new cell
        Abc_SclObjSetCell( pObj, pCellNew );
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        // recompute timing
        Abc_SclTimeCone( p, vNodes );
        // set old cell
        Abc_SclObjSetCell( pObj, pCellOld );
        Abc_SclLoadRestore( p, pObj );
        // evaluate gain
        dGain = Abc_SclEvalPerformLegal( p, vEvals, p->MaxDelay0 );
        if ( dGain == -1 )
            continue;
        // save best gain
        if ( dGainBest < dGain )
        {
            dGainBest = dGain;
            gateBest = pCellNew->Id;
        }
    } 
    // put back old cell and timing
    Abc_SclObjSetCell( pObj, pCellOld );
    Abc_SclConeRestore( p, vNodes );
p->timeSize += Abc_Clock() - clk;
    if ( gateBest >= 0 )
    {
        pCellNew = SC_LibCell( p->pLib, gateBest );
        Abc_SclObjSetCell( pObj, pCellNew );
        p->SumArea += pCellNew->area - pCellOld->area;
//        printf( "%f   %f -> %f\n", pCellNew->area - pCellOld->area, p->SumArea - (pCellNew->area - pCellOld->area), p->SumArea );
//        printf( "%6d  %20s -> %20s  %f -> %f\n", Abc_ObjId(pObj), pCellOld->pName, pCellNew->pName, pCellOld->area, pCellNew->area );
        // mark used nodes with the current trav ID
        Abc_NtkForEachObjVec( vNodes, p->pNtk, pTemp, k )
            Abc_NodeSetTravIdCurrent( pTemp );
        // update load and timing...
        Abc_SclUpdateLoad( p, pObj, pCellOld, pCellNew );
        Abc_SclTimeIncInsert( p, pObj );
        return 1;
    }
    return 0;
}